

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int update_msacsr(CPUMIPSState_conflict10 *env,int action,int denormal)

{
  uint uVar1;
  int enable;
  int cause;
  int c;
  int ieee_ex;
  int denormal_local;
  int action_local;
  CPUMIPSState_conflict10 *env_local;
  
  cause = get_float_exception_flags(&(env->active_tc).msa_fp_status);
  if (denormal != 0) {
    cause = cause | 0x10;
  }
  enable = ieee_ex_to_mips_mips64el(cause);
  uVar1 = (env->active_tc).msacsr >> 7;
  if (((cause & 0x40U) != 0) && (((env->active_tc).msacsr & 0x1000000U) != 0)) {
    if ((action & 2U) == 0) {
      enable = enable | 1;
    }
    else {
      enable = enable & 0xfffffffe;
    }
  }
  if (((cause & 0x80U) != 0) && (((env->active_tc).msacsr & 0x1000000U) != 0)) {
    if ((action & 1U) == 0) {
      enable = enable | 3;
    }
    else {
      enable = enable & 0xfffffffdU | 1;
    }
  }
  if (((enable & 4U) != 0) && ((uVar1 & 4) == 0)) {
    enable = enable | 1;
  }
  if ((((enable & 2U) != 0) && ((uVar1 & 2) == 0)) && ((enable & 1U) == 0)) {
    enable = enable & 0xfffffffd;
  }
  if (((action & 4U) != 0) && ((enable & 0x18U) == 0)) {
    enable = 1;
  }
  if ((enable & (uVar1 & 0x1f | 0x20)) == 0) {
    (env->active_tc).msacsr =
         (env->active_tc).msacsr & 0xfffc0fffU |
         ((env->active_tc).msacsr >> 0xc & 0x3fU | enable & 0x3fU) << 0xc;
  }
  else if (((env->active_tc).msacsr & 0x40000U) == 0) {
    (env->active_tc).msacsr =
         (env->active_tc).msacsr & 0xfffc0fffU |
         ((env->active_tc).msacsr >> 0xc & 0x3fU | enable & 0x3fU) << 0xc;
  }
  return enable;
}

Assistant:

static inline int update_msacsr(CPUMIPSState *env, int action, int denormal)
{
    int ieee_ex;

    int c;
    int cause;
    int enable;

    ieee_ex = get_float_exception_flags(&env->active_tc.msa_fp_status);

    /* QEMU softfloat does not signal all underflow cases */
    if (denormal) {
        ieee_ex |= float_flag_underflow;
    }

    c = ieee_ex_to_mips(ieee_ex);
    enable = GET_FP_ENABLE(env->active_tc.msacsr) | FP_UNIMPLEMENTED;

    /* Set Inexact (I) when flushing inputs to zero */
    if ((ieee_ex & float_flag_input_denormal) &&
            (env->active_tc.msacsr & MSACSR_FS_MASK) != 0) {
        if (action & CLEAR_IS_INEXACT) {
            c &= ~FP_INEXACT;
        } else {
            c |=  FP_INEXACT;
        }
    }

    /* Set Inexact (I) and Underflow (U) when flushing outputs to zero */
    if ((ieee_ex & float_flag_output_denormal) &&
            (env->active_tc.msacsr & MSACSR_FS_MASK) != 0) {
        c |= FP_INEXACT;
        if (action & CLEAR_FS_UNDERFLOW) {
            c &= ~FP_UNDERFLOW;
        } else {
            c |=  FP_UNDERFLOW;
        }
    }

    /* Set Inexact (I) when Overflow (O) is not enabled */
    if ((c & FP_OVERFLOW) != 0 && (enable & FP_OVERFLOW) == 0) {
        c |= FP_INEXACT;
    }

    /* Clear Exact Underflow when Underflow (U) is not enabled */
    if ((c & FP_UNDERFLOW) != 0 && (enable & FP_UNDERFLOW) == 0 &&
            (c & FP_INEXACT) == 0) {
        c &= ~FP_UNDERFLOW;
    }

    /*
     * Reciprocal operations set only Inexact when valid and not
     * divide by zero
     */
    if ((action & RECIPROCAL_INEXACT) &&
            (c & (FP_INVALID | FP_DIV0)) == 0) {
        c = FP_INEXACT;
    }

    cause = c & enable;    /* all current enabled exceptions */

    if (cause == 0) {
        /*
         * No enabled exception, update the MSACSR Cause
         * with all current exceptions
         */
        SET_FP_CAUSE(env->active_tc.msacsr,
                (GET_FP_CAUSE(env->active_tc.msacsr) | c));
    } else {
        /* Current exceptions are enabled */
        if ((env->active_tc.msacsr & MSACSR_NX_MASK) == 0) {
            /*
             * Exception(s) will trap, update MSACSR Cause
             * with all enabled exceptions
             */
            SET_FP_CAUSE(env->active_tc.msacsr,
                    (GET_FP_CAUSE(env->active_tc.msacsr) | c));
        }
    }

    return c;
}